

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_Fill(FillForm1 Fill)

{
  uint8_t value;
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image image;
  ImageTemplate<unsigned_char> local_40;
  
  Unit_Test::intensityArray(&intensity,2);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_40,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,&local_40);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_40);
  (*Fill)(&image,intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start[1]);
  bVar1 = Unit_Test::verifyImage
                    (&image,intensity.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[1]);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form1_Fill(FillForm1 Fill)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image = uniformImage( intensity[0] );

        Fill( image, intensity[1] );

        return verifyImage( image, intensity[1] );
    }